

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

ItemList *
Lib::UniquePersistentIterator<Kernel::BooleanSubtermIt>::getUniqueItemList
          (BooleanSubtermIt *inn,size_t *sizeRef)

{
  byte bVar1;
  bool bVar2;
  TermList TVar3;
  DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this;
  long *in_RSI;
  long *in_RDI;
  T el;
  Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  iset;
  ItemList *res;
  List<Kernel::TermList> **in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_ffffffffffffffd0;
  ItemList *local_18;
  
  local_18 = (ItemList *)0x0;
  Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  *in_RSI = 0;
  while (bVar1 = (**(code **)(*in_RDI + 0x10))(), (bVar1 & 1) != 0) {
    TVar3._content = (**(code **)(*in_RDI + 0x18))();
    this = Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           ::operator->((Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x8522b7);
    bVar2 = DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert(this,TVar3);
    if (bVar2) {
      TVar3._content._7_1_ = bVar2;
      TVar3._content._0_7_ = in_stack_ffffffffffffff90;
      List<Kernel::TermList>::push(TVar3,in_stack_ffffffffffffff88);
      *in_RSI = *in_RSI + 1;
    }
  }
  Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(in_stack_ffffffffffffffd0);
  return local_18;
}

Assistant:

static ItemList* getUniqueItemList(Inner& inn, size_t& sizeRef)
  {
    ItemList* res=0;
    Recycled<ItemSet> iset;

    sizeRef=0;
    while(inn.hasNext()) {
      T el=inn.next();
      if(iset->insert(el)) {
	ItemList::push(el, res);
	sizeRef++;
      }
    }

    return res;
  }